

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pending-c.cpp
# Opt level: O1

duckdb_pending_state duckdb_pending_execute_check_state(duckdb_pending_result pending_result)

{
  bool bVar1;
  PendingExecutionResult PVar2;
  pointer pPVar3;
  duckdb_pending_state dVar4;
  
  dVar4 = DUCKDB_PENDING_ERROR;
  if ((pending_result != (duckdb_pending_result)0x0) && (*(long *)pending_result != 0)) {
    pPVar3 = duckdb::
             unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)pending_result);
    bVar1 = duckdb::BaseQueryResult::HasError(&pPVar3->super_BaseQueryResult);
    if (!bVar1) {
      pPVar3 = duckdb::
               unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
               ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                             *)pending_result);
      PVar2 = duckdb::PendingQueryResult::CheckPulse(pPVar3);
      if (PVar2 < EXECUTION_FINISHED) {
        dVar4 = *(duckdb_pending_state *)(&DAT_013b890c + (ulong)PVar2 * 4);
      }
    }
  }
  return dVar4;
}

Assistant:

duckdb_pending_state duckdb_pending_execute_check_state(duckdb_pending_result pending_result) {
	if (!pending_result) {
		return DUCKDB_PENDING_ERROR;
	}
	auto wrapper = reinterpret_cast<PendingStatementWrapper *>(pending_result);
	if (!wrapper->statement) {
		return DUCKDB_PENDING_ERROR;
	}
	if (wrapper->statement->HasError()) {
		return DUCKDB_PENDING_ERROR;
	}
	PendingExecutionResult return_value;
	try {
		return_value = wrapper->statement->CheckPulse();
	} catch (std::exception &ex) {
		wrapper->statement->SetError(duckdb::ErrorData(ex));
		return DUCKDB_PENDING_ERROR;
	}
	switch (return_value) {
	case PendingExecutionResult::BLOCKED:
	case PendingExecutionResult::RESULT_READY:
		return DUCKDB_PENDING_RESULT_READY;
	case PendingExecutionResult::NO_TASKS_AVAILABLE:
		return DUCKDB_PENDING_NO_TASKS_AVAILABLE;
	case PendingExecutionResult::RESULT_NOT_READY:
		return DUCKDB_PENDING_RESULT_NOT_READY;
	default:
		return DUCKDB_PENDING_ERROR;
	}
}